

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::ASTVisitor<no_dot_var_in_port_connection::MainVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::RandCaseStatement>
          (ASTVisitor<no_dot_var_in_port_connection::MainVisitor,_true,_true,_false,_false> *this,
          RandCaseStatement *t)

{
  size_t sVar1;
  pointer pIVar2;
  Expression *this_00;
  long lVar3;
  
  sVar1 = (t->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar2 = (t->items)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)&(pIVar2->expr).ptr + lVar3);
      Expression::
      visitExpression<slang::ast::Expression_const,no_dot_var_in_port_connection::MainVisitor&>
                (this_00,this_00,(AlwaysFFVisitor *)this);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
  }
  sVar1 = (t->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar2 = (t->items)._M_ptr;
    lVar3 = 0;
    do {
      Statement::visit<no_dot_var_in_port_connection::MainVisitor&>
                (*(Statement **)((long)&(pIVar2->stmt).ptr + lVar3),(AlwaysFFVisitor *)this);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }